

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O2

WJTL_STATUS TestUnmarshallListAlreadyHasContents(void)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  JL_STATUS JVar4;
  JL_STATUS JVar5;
  JL_STATUS JVar6;
  long lVar7;
  WJTL_STATUS WVar8;
  undefined8 *puVar9;
  JlMarshallElement *pJVar10;
  bool Condition;
  bool Condition_00;
  bool Condition_01;
  bool Condition_02;
  size_t errorAtPos;
  TheStruct theStruct;
  JlMarshallElement marshalTheStruct [1];
  
  errorAtPos = 0;
  puVar9 = &DAT_001415f0;
  pJVar10 = marshalTheStruct;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)pJVar10 = *puVar9;
    puVar9 = puVar9 + 1;
    pJVar10 = (JlMarshallElement *)&pJVar10->Name;
  }
  theStruct.NumArray = (uint32_t *)0x0;
  theStruct.NumArrayCount = 0;
  JVar4 = JlJsonToStruct("{\"NumList\":[1,2]}",marshalTheStruct,1,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumList\\\":[1,2]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57a);
  Condition = errorAtPos == 0;
  WjTestLib_Assert(Condition,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57b);
  Condition_00 = theStruct.NumArrayCount == 2;
  WjTestLib_Assert(Condition_00,"2 == theStruct.NumArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57c);
  uVar1 = *theStruct.NumArray;
  WjTestLib_Assert(uVar1 == 1,"1 == theStruct.NumArray[0]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57d);
  uVar2 = theStruct.NumArray[1];
  WjTestLib_Assert(uVar2 == 2,"2 == theStruct.NumArray[1]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57e);
  JVar5 = JlJsonToStruct("{\"NumList\":[3]}",marshalTheStruct,1,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumList\\\":[3]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x581);
  Condition_01 = errorAtPos == 0;
  WjTestLib_Assert(Condition_01,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x582);
  Condition_02 = theStruct.NumArrayCount == 1;
  WjTestLib_Assert(Condition_02,"1 == theStruct.NumArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x583);
  uVar3 = *theStruct.NumArray;
  WjTestLib_Assert(uVar3 == 3,"3 == theStruct.NumArray[0]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x584);
  JVar6 = JlUnmarshallFreeStructAllocs(marshalTheStruct,1,&theStruct);
  WVar8 = WJTL_STATUS_SUCCESS;
  if ((uVar3 != 3 || (!Condition_02 || !Condition_01)) ||
      ((JVar5 != JL_STATUS_SUCCESS || uVar2 != 2) ||
      (uVar1 != 1 || (!Condition_00 || (!Condition || JVar4 != JL_STATUS_SUCCESS))))) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (JVar6 != JL_STATUS_SUCCESS) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x587);
  return WVar8;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallListAlreadyHasContents
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint32_t*   NumArray;
        size_t      NumArrayCount;
    } TheStruct;

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallUnsignedArray( TheStruct, NumArray, NumArrayCount, "NumList" )
    };

    TheStruct theStruct = {0};

    // Fill in struct with values
    JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumList\":[1,2]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.NumArrayCount );
    JL_ASSERT( 1 == theStruct.NumArray[0] );
    JL_ASSERT( 2 == theStruct.NumArray[1] );

    // Now unmarshall again when struct already has a list with contents.
    JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumList\":[3]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 1 == theStruct.NumArrayCount );
    JL_ASSERT( 3 == theStruct.NumArray[0] );

    // Free and make sure no memory leak
    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );

    return TestReturn;
}